

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.hpp
# Opt level: O0

void __thiscall
gl4cts::GLSL420Pack::BindingSamplerArrayTest::~BindingSamplerArrayTest
          (BindingSamplerArrayTest *this)

{
  BindingSamplerArrayTest *this_local;
  
  ~BindingSamplerArrayTest(this);
  operator_delete(this,0x128);
  return;
}

Assistant:

virtual ~BindingSamplerArrayTest()
	{
	}